

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O2

void __thiscall DialogPrompt::DialogPrompt(DialogPrompt *this)

{
  Vector2f local_38;
  
  UIComponent::UIComponent(&this->super_UIComponent);
  (this->super_UIComponent).super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__DialogPrompt_001c52b0;
  (this->super_UIComponent).super_Transformable._vptr_Transformable =
       (_func_int **)&PTR__DialogPrompt_001c52e8;
  sf::Text::Text(&this->text);
  local_38.x = 0.0;
  local_38.y = 0.0;
  sf::RectangleShape::RectangleShape(&this->background,&local_38);
  (this->optionChecks).super__Vector_base<CheckBox,_std::allocator<CheckBox>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->optionChecks).super__Vector_base<CheckBox,_std::allocator<CheckBox>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->optionFields).super__Vector_base<TextField,_std::allocator<TextField>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->optionFields).super__Vector_base<TextField,_std::allocator<TextField>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->optionChecks).super__Vector_base<CheckBox,_std::allocator<CheckBox>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->optionButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->optionFields).super__Vector_base<TextField,_std::allocator<TextField>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->optionButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->optionButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = (Vector2f)this;
  std::vector<DialogPrompt*,std::allocator<DialogPrompt*>>::emplace_back<DialogPrompt*>
            ((vector<DialogPrompt*,std::allocator<DialogPrompt*>> *)&UserInterface::_dialogPrompts,
             (DialogPrompt **)&local_38);
  return;
}

Assistant:

DialogPrompt::DialogPrompt() {
    UserInterface::_dialogPrompts.push_back(this);
}